

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

void __thiscall
SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::EditingIterator::
RemoveCurrent(EditingIterator *this,HeapAllocator *allocator)

{
  NodeBase *pNVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_48;
  FreeFuncType freeFunc;
  NodeBase *dead;
  HeapAllocator *allocator_local;
  EditingIterator *this_local;
  
  pNVar1 = (this->super_Iterator).current;
  UnlinkCurrent(this);
  local_48 = (code *)Memory::
                     TypeAllocatorFunc<Memory::HeapAllocator,_Memory::RecyclerWeakReferenceRegion>::
                     GetFreeFunc();
  plVar2 = (long *)((long)&allocator->m_privateHeap + extraout_RDX);
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 + *plVar2 + -1);
  }
  (*local_48)(plVar2,pNVar1,0x20);
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            const NodeBase *dead = this->current;
            UnlinkCurrent();

            auto freeFunc = TypeAllocatorFunc<TAllocator, TData>::GetFreeFunc();

            AllocatorFree(allocator, freeFunc, (Node *) dead, sizeof(Node));
        }